

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_status(FILE *ftp,char *statusstr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_554;
  int ftpcode;
  int len;
  char errorstr [100];
  char local_4d8 [8];
  char recbuf [1200];
  char *statusstr_local;
  FILE *ftp_local;
  
  sVar2 = strlen(statusstr);
  while( true ) {
    pcVar3 = fgets(local_4d8,0x4b0,(FILE *)ftp);
    if (pcVar3 == (char *)0x0) {
      snprintf((char *)&ftpcode,100,"ERROR: ftp_status wants %s but fgets returned 0",statusstr);
      ffpmsg((char *)&ftpcode);
      return 1;
    }
    local_4d8[(int)sVar2] = '\0';
    iVar1 = strcmp(local_4d8,statusstr);
    if (iVar1 == 0) break;
    if ('3' < local_4d8[0]) {
      snprintf((char *)&ftpcode,100,"ERROR ftp_status wants %s but got %s",statusstr,local_4d8);
      ffpmsg((char *)&ftpcode);
      local_554 = atoi(local_4d8);
      if (local_554 == 0) {
        local_554 = 1;
      }
      return local_554;
    }
    snprintf((char *)&ftpcode,100,"ERROR ftp_status wants %s but got unexpected %s",statusstr,
             local_4d8);
    ffpmsg((char *)&ftpcode);
  }
  return 0;
}

Assistant:

static int ftp_status(FILE *ftp, char *statusstr)
{
  /* read through until we find a string beginning with statusstr */
  /* This needs a timeout */
  
  /* Modified 2/19 to return the numerical value of the returned status when
     it differs from the requested status. */

  char recbuf[MAXLEN], errorstr[SHORTLEN];
  int len, ftpcode=0;

  len = strlen(statusstr);
  while (1) {

    if (!(fgets(recbuf,MAXLEN,ftp))) {
      snprintf(errorstr,SHORTLEN,"ERROR: ftp_status wants %s but fgets returned 0",statusstr);
      ffpmsg(errorstr);
      return 1; /* error reading */
    }

    recbuf[len] = '\0'; /* make it short */
    if (!strcmp(recbuf,statusstr)) {
      return 0; /* we're ok */
    }
    if (recbuf[0] > '3') {
      /* oh well, some sort of error. */
      snprintf(errorstr,SHORTLEN,"ERROR ftp_status wants %s but got %s", statusstr, recbuf);
      ffpmsg(errorstr);
      /* Return the numerical code, if string can be converted to int.
         But must not return 0 from here. */
      ftpcode = atoi(recbuf);
      return ftpcode ? ftpcode : 1; 
    }
    snprintf(errorstr,SHORTLEN,"ERROR ftp_status wants %s but got unexpected %s", statusstr, recbuf);
    ffpmsg(errorstr);
  }
}